

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::storage_impl_base::rename_table
          (storage_impl_base *this,sqlite3 *db,string *oldName,string *newName)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  error_category *peVar5;
  string *in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  statement_finalizer finalizer;
  sqlite3_stmt *stmt;
  __string_type query;
  stringstream ss;
  error_code local_208;
  error_code local_1f8;
  statement_finalizer in_stack_fffffffffffffe18;
  system_error *in_stack_fffffffffffffe20;
  error_code in_stack_fffffffffffffe28;
  stringstream local_1a8 [16];
  ostream local_198;
  string *local_20;
  string *local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(&local_198,"ALTER TABLE ");
  poVar2 = std::operator<<(poVar2,local_18);
  poVar2 = std::operator<<(poVar2," RENAME TO ");
  std::operator<<(poVar2,local_20);
  std::__cxx11::stringstream::str();
  uVar4 = local_10;
  uVar3 = std::__cxx11::string::c_str();
  iVar1 = sqlite3_prepare_v2(uVar4,uVar3,0xffffffff,&stack0xfffffffffffffe20,0);
  if (iVar1 != 0) {
    uVar4 = __cxa_allocate_exception(0x20);
    iVar1 = sqlite3_errcode(local_10);
    peVar5 = &get_sqlite_error_category()->super_error_category;
    std::error_code::error_code(&local_208,iVar1,peVar5);
    sqlite3_errmsg(local_10);
    std::system_error::system_error
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe18.stmt);
    __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  statement_finalizer::statement_finalizer
            ((statement_finalizer *)&stack0xfffffffffffffe18,
             (sqlite3_stmt *)in_stack_fffffffffffffe20);
  iVar1 = sqlite3_step(in_stack_fffffffffffffe20);
  if (iVar1 == 0x65) {
    statement_finalizer::~statement_finalizer((statement_finalizer *)0x25b2da);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    std::__cxx11::stringstream::~stringstream(local_1a8);
    return;
  }
  uVar4 = __cxa_allocate_exception(0x20);
  iVar1 = sqlite3_errcode(local_10);
  peVar5 = &get_sqlite_error_category()->super_error_category;
  std::error_code::error_code(&local_1f8,iVar1,peVar5);
  sqlite3_errmsg(local_10);
  std::system_error::system_error
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
             (char *)in_stack_fffffffffffffe18.stmt);
  __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void rename_table(sqlite3 *db, const std::string &oldName, const std::string &newName) const {
        std::stringstream ss;
        ss << "ALTER TABLE " << oldName << " RENAME TO " << newName;
        auto query = ss.str();
        sqlite3_stmt *stmt;
        if(sqlite3_prepare_v2(db, query.c_str(), -1, &stmt, nullptr) == SQLITE_OK) {
            statement_finalizer finalizer{stmt};
            if(sqlite3_step(stmt) == SQLITE_DONE) {
                //  done..
            } else {
                throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                        sqlite3_errmsg(db));
            }
        } else {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }